

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

uint __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
::bubbleUp(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
           *this,uint index)

{
  uint uVar1;
  Comparison CVar2;
  uint in_ESI;
  UnresolvedSplitRecord *in_RDI;
  uint nextIndex;
  uint uVar3;
  
  uVar1 = in_ESI >> 1;
  while( true ) {
    uVar3 = uVar1;
    if (uVar3 == 0) {
      return 1;
    }
    CVar2 = Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>::compare
                      ((UnresolvedSplitRecord *)CONCAT44(in_ESI,uVar3),in_RDI);
    if (CVar2 != LESS) break;
    std::swap<Indexing::UnresolvedSplitRecord>
              ((UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)in_ESI * 0x10),
               (UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)uVar3 * 0x10));
    uVar1 = uVar3 >> 1;
    in_ESI = uVar3;
  }
  return in_ESI;
}

Assistant:

unsigned bubbleUp(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index>>1;
    while(nextIndex) {
      if(Comparator::compare(_data1[index], _data1[nextIndex])==LESS) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index>>1;
    }
    return 1;
  }